

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_input_t * mpc_input_new_pipe(char *filename,FILE *pipe)

{
  mpc_input_t *pmVar1;
  size_t sVar2;
  char *pcVar3;
  mpc_state_t *pmVar4;
  
  pmVar1 = (mpc_input_t *)malloc(0x8278);
  sVar2 = strlen(filename);
  pcVar3 = (char *)malloc(sVar2 + 1);
  pmVar1->filename = pcVar3;
  strcpy(pcVar3,filename);
  pmVar1->type = 2;
  (pmVar1->state).pos = 0;
  (pmVar1->state).row = 0;
  *(undefined8 *)((long)&(pmVar1->state).row + 4) = 0;
  *(undefined8 *)((long)&(pmVar1->state).col + 4) = 0;
  pmVar1->string = (char *)0x0;
  pmVar1->buffer = (char *)0x0;
  pmVar1->file = pipe;
  pmVar1->suppress = 0;
  pmVar1->backtrack = 1;
  pmVar1->marks_slots = 0x20;
  pmVar1->marks_num = 0;
  pmVar4 = (mpc_state_t *)malloc(0x400);
  pmVar1->marks = pmVar4;
  pcVar3 = (char *)malloc(0x20);
  pmVar1->lasts = pcVar3;
  pmVar1->last = '\0';
  memset(&pmVar1->mem_index,0,0x208);
  return pmVar1;
}

Assistant:

static mpc_input_t *mpc_input_new_pipe(const char *filename, FILE *pipe) {

  mpc_input_t *i = malloc(sizeof(mpc_input_t));

  i->filename = malloc(strlen(filename) + 1);
  strcpy(i->filename, filename);

  i->type = MPC_INPUT_PIPE;
  i->state = mpc_state_new();

  i->string = NULL;
  i->buffer = NULL;
  i->file = pipe;

  i->suppress = 0;
  i->backtrack = 1;
  i->marks_num = 0;
  i->marks_slots = MPC_INPUT_MARKS_MIN;
  i->marks = malloc(sizeof(mpc_state_t) * i->marks_slots);
  i->lasts = malloc(sizeof(char) * i->marks_slots);
  i->last = '\0';

  i->mem_index = 0;
  memset(i->mem_full, 0, sizeof(char) * MPC_INPUT_MEM_NUM);

  return i;

}